

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void __thiscall
Assimp::glTF2Exporter::GetMatTex
          (glTF2Exporter *this,aiMaterial *mat,Ref<glTF2::Texture> *texture,aiTextureType tt,
          uint slot)

{
  _Rb_tree_color _Var1;
  Asset *this_00;
  Texture *pTVar2;
  aiTexture **ppaVar3;
  aiTexture *paVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint uVar7;
  aiReturn aVar8;
  int iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  Ref<glTF2::Texture> RVar12;
  Ref<glTF2::Image> RVar13;
  allocator<char> local_4c1;
  Asset *local_4c0;
  string mimeType;
  string imgId;
  string path;
  string texId;
  aiString tex;
  
  uVar7 = aiGetMaterialTextureCount(mat,tt);
  if (uVar7 != 0) {
    tex.length = 0;
    tex.data[0] = '\0';
    memset(tex.data + 1,0x1b,0x3ff);
    aVar8 = aiGetMaterialString(mat,"$tex.file",tt,slot,&tex);
    if (aVar8 == aiReturn_SUCCESS) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,tex.data,(allocator<char> *)&texId);
      if (path._M_string_length != 0) {
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&(this->mTexturesByPath)._M_t,&path);
        if ((_Rb_tree_header *)iVar10._M_node ==
            &(this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header) {
          if (texture->vector == (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0)
          {
            local_4c0 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&imgId,"",(allocator<char> *)&mimeType);
            glTF2::Asset::FindUniqueID(&texId,local_4c0,&imgId,"texture");
            std::__cxx11::string::~string((string *)&imgId);
            RVar12 = glTF2::LazyDict<glTF2::Texture>::Create
                               (&((this->mAsset).
                                  super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->textures,texId._M_dataplus._M_p);
            texture->vector = RVar12.vector;
            local_4c0 = (Asset *)CONCAT44(local_4c0._4_4_,RVar12.index);
            texture->index = RVar12.index;
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[](&this->mTexturesByPath,&path);
            *pmVar11 = (mapped_type)local_4c0;
            this_00 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            std::__cxx11::string::string<std::allocator<char>>((string *)&mimeType,"",&local_4c1);
            glTF2::Asset::FindUniqueID(&imgId,this_00,&mimeType,"image");
            std::__cxx11::string::~string((string *)&mimeType);
            RVar13 = glTF2::LazyDict<glTF2::Image>::Create
                               (&((this->mAsset).
                                  super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->images,imgId._M_dataplus._M_p);
            pTVar2 = (texture->vector->
                     super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[texture->index];
            (pTVar2->source).vector = RVar13.vector;
            (pTVar2->source).index = RVar13.index;
            if (*path._M_dataplus._M_p == '*') {
              ppaVar3 = this->mScene->mTextures;
              iVar9 = atoi(path._M_dataplus._M_p + 1);
              paVar4 = ppaVar3[iVar9];
              pTVar2 = (texture->vector->
                       super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[texture->index];
              glTF2::Image::SetData
                        (*(Image **)
                          (*(long *)&((pTVar2->source).vector)->
                                     super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                          + (ulong)(pTVar2->source).index * 8),&paVar4->pcData->b,
                         (ulong)paVar4->mWidth,
                         (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              if (paVar4->achFormatHint[0] != '\0') {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&mimeType,"image/",&local_4c1);
                bcmp(paVar4->achFormatHint,"jpg",3);
                std::__cxx11::string::append((char *)&mimeType);
                pTVar2 = (texture->vector->
                         super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[texture->index];
                std::__cxx11::string::_M_assign
                          ((string *)
                           (*(long *)(*(long *)&((pTVar2->source).vector)->
                                                super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                                     + (ulong)(pTVar2->source).index * 8) + 0x80));
                std::__cxx11::string::~string((string *)&mimeType);
              }
            }
            else {
              pTVar2 = (texture->vector->
                       super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[texture->index];
              std::__cxx11::string::_M_assign
                        ((string *)
                         (*(long *)(*(long *)&((pTVar2->source).vector)->
                                              super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                                   + (ulong)(pTVar2->source).index * 8) + 0x50));
            }
            uVar5 = texture->vector;
            uVar6 = texture->index;
            RVar12.index = uVar6;
            RVar12.vector = (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)uVar5;
            RVar12._12_4_ = 0;
            GetTexSampler(this,mat,RVar12,tt,slot);
            std::__cxx11::string::~string((string *)&imgId);
            std::__cxx11::string::~string((string *)&texId);
          }
        }
        else {
          _Var1 = iVar10._M_node[2]._M_color;
          texture->vector =
               &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->textures).mObjs;
          texture->index = _Var1;
        }
      }
      std::__cxx11::string::~string((string *)&path);
    }
  }
  return;
}

Assistant:

void glTF2Exporter::GetMatTex(const aiMaterial* mat, Ref<Texture>& texture, aiTextureType tt, unsigned int slot = 0)
{

    if (mat->GetTextureCount(tt) > 0) {
        aiString tex;

        if (mat->Get(AI_MATKEY_TEXTURE(tt, slot), tex) == AI_SUCCESS) {
            std::string path = tex.C_Str();

            if (path.size() > 0) {
                std::map<std::string, unsigned int>::iterator it = mTexturesByPath.find(path);
                if (it != mTexturesByPath.end()) {
                    texture = mAsset->textures.Get(it->second);
                }

                if (!texture) {
                    std::string texId = mAsset->FindUniqueID("", "texture");
                    texture = mAsset->textures.Create(texId);
                    mTexturesByPath[path] = texture.GetIndex();

                    std::string imgId = mAsset->FindUniqueID("", "image");
                    texture->source = mAsset->images.Create(imgId);

                    if (path[0] == '*') { // embedded
                        aiTexture* tex = mScene->mTextures[atoi(&path[1])];

                        uint8_t* data = reinterpret_cast<uint8_t*>(tex->pcData);
                        texture->source->SetData(data, tex->mWidth, *mAsset);

                        if (tex->achFormatHint[0]) {
                            std::string mimeType = "image/";
                            mimeType += (memcmp(tex->achFormatHint, "jpg", 3) == 0) ? "jpeg" : tex->achFormatHint;
                            texture->source->mimeType = mimeType;
                        }
                    }
                    else {
                        texture->source->uri = path;
                    }

                    GetTexSampler(mat, texture, tt, slot);
                }
            }
        }
    }
}